

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O0

void dam_message(CHAR_DATA *ch,CHAR_DATA *victim,int dam,int dt,bool immune,char *dnoun,bool reduced
                )

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  const_reference pvVar7;
  size_t sVar8;
  uint in_ECX;
  int in_EDX;
  CHAR_DATA *in_RSI;
  CHAR_DATA *in_RDI;
  byte in_R8B;
  long in_R9;
  bool bVar9;
  byte in_stack_00000008;
  bool duped;
  bool asterisk;
  int prop;
  char punct;
  char *attack2;
  char *attack;
  char *vp;
  char *vs;
  CHAR_DATA *gch;
  OBJ_DATA *wield;
  char buf97 [256];
  char buf3 [256];
  char buf2 [256];
  char buf1 [256];
  int in_stack_00000bcc;
  long in_stack_00000bd0;
  long in_stack_00000bd8;
  OBJ_DATA *in_stack_00000be0;
  CHAR_DATA *in_stack_00000be8;
  char *in_stack_00000bf0;
  int in_stack_00001eb0;
  int in_stack_00001eb4;
  void *in_stack_00001eb8;
  void *in_stack_00001ec0;
  CHAR_DATA *in_stack_00001ec8;
  char *in_stack_00001ed0;
  char *in_stack_fffffffffffff978;
  undefined4 uVar10;
  undefined1 uVar11;
  int in_stack_fffffffffffff980;
  undefined4 in_stack_fffffffffffff984;
  CHAR_DATA *in_stack_fffffffffffff988;
  char *in_stack_fffffffffffff990;
  CHAR_DATA *in_stack_fffffffffffff998;
  CHAR_DATA *pCVar12;
  char *in_stack_fffffffffffff9a8;
  char local_489;
  int local_470;
  CHAR_DATA *local_460;
  char *local_458;
  char *local_450;
  CHAR_DATA *local_448;
  OBJ_DATA *local_440;
  char local_438 [256];
  char local_338 [256];
  char local_238 [256];
  char local_138 [271];
  byte local_29;
  long local_28;
  byte local_19;
  uint local_18;
  CHAR_DATA *local_10;
  CHAR_DATA *local_8;
  
  local_19 = in_R8B & 1;
  local_29 = in_stack_00000008 & 1;
  local_460 = (CHAR_DATA *)0x0;
  bVar1 = false;
  bVar9 = false;
  local_470 = in_EDX;
  if (in_EDX < 0) {
    local_470 = 0;
  }
  if ((((in_RDI != (CHAR_DATA *)0x0) && (in_RSI != (CHAR_DATA *)0x0)) &&
      (in_RSI->in_room != (ROOM_INDEX_DATA *)0x0)) && (in_RDI->in_room != (ROOM_INDEX_DATA *)0x0)) {
    if (local_29 == 0) {
      if (local_470 == 0) {
        local_450 = "miss";
        local_458 = "misses";
      }
      else if (local_470 < 3) {
        local_450 = "scratch";
        local_458 = "scratches";
      }
      else if (local_470 < 5) {
        local_450 = "graze";
        local_458 = "grazes";
      }
      else if (local_470 < 8) {
        local_450 = "hit";
        local_458 = "hits";
      }
      else if (local_470 < 0xc) {
        local_450 = "injure";
        local_458 = "injures";
      }
      else if (local_470 < 0x10) {
        local_450 = "wound";
        local_458 = "wounds";
      }
      else if (local_470 < 0x15) {
        local_450 = "maul";
        local_458 = "mauls";
      }
      else if (local_470 < 0x1a) {
        local_450 = "decimate";
        local_458 = "decimates";
      }
      else if (local_470 < 0x1f) {
        local_450 = "devastate";
        local_458 = "devastates";
      }
      else if (local_470 < 0x26) {
        local_450 = "maim";
        local_458 = "maims";
      }
      else if (local_470 < 0x2e) {
        local_450 = "MUTILATE";
        local_458 = "MUTILATES";
      }
      else if (local_470 < 0x38) {
        local_450 = "EVISCERATE";
        local_458 = "EVISCERATES";
      }
      else if (local_470 < 0x42) {
        local_450 = "DISMEMBER";
        local_458 = "DISMEMBERS";
      }
      else if (local_470 < 0x56) {
        local_450 = "MASSACRE";
        local_458 = "MASSACRES";
      }
      else if (local_470 < 0x65) {
        local_450 = "MANGLE";
        local_458 = "MANGLES";
      }
      else if (local_470 < 0x88) {
        local_450 = "*** DEMOLISH ***";
        local_458 = "*** DEMOLISHES ***";
      }
      else if (local_470 < 0xa1) {
        local_450 = "*** DEVASTATE ***";
        local_458 = "*** DEVASTATES ***";
      }
      else if (local_470 < 0xfb) {
        local_450 = "=== OBLITERATE ===";
        local_458 = "=== OBLITERATES ===";
      }
      else if (local_470 < 0x14b) {
        local_450 = ">>> ANNIHILATE <<<";
        local_458 = ">>> ANNIHILATES <<<";
      }
      else if (local_470 < 0x17d) {
        local_450 = "<<< ERADICATE >>>";
        local_458 = "<<< ERADICATES >>>";
      }
      else {
        local_450 = "do UNSPEAKABLE things to";
        local_458 = "does UNSPEAKABLE things to";
      }
    }
    else {
      local_450 = "\x1b[0mfail to harm";
      local_458 = "\x1b[0mfails to harm";
    }
    local_489 = '.';
    if (0x21 < local_470) {
      local_489 = '!';
    }
    local_28 = in_R9;
    local_18 = in_ECX;
    local_10 = in_RSI;
    local_8 = in_RDI;
    if (in_ECX == (int)gsn_dual_wield) {
      if (in_ECX == (int)gsn_dual_wield) {
        local_440 = get_eq_char(in_RDI,0x12);
      }
      if (local_440 == (OBJ_DATA *)0x0) {
        iVar3 = (int)local_8->dam_type;
      }
      else {
        iVar3 = local_440->value[3];
      }
      local_18 = iVar3 + 1000;
    }
    if (local_18 == 1000) {
      if (local_8 == local_10) {
        if (local_470 < local_10->max_hit) {
          sprintf(local_138,"$n %s $mself%c",local_458,(ulong)(uint)(int)local_489);
          pcVar4 = get_char_color(in_stack_fffffffffffff998,in_stack_fffffffffffff990);
          pcVar5 = END_COLOR(in_stack_fffffffffffff988);
          sprintf(local_238,"You %s%s%s yourself%c",pcVar4,local_450,pcVar5,
                  (ulong)(uint)(int)local_489);
        }
        else {
          sprintf(local_138,"$n\'s assault slays $mself outright!");
          sprintf(local_238,"Your assault slays you outright!");
        }
      }
      else {
        for (local_448 = local_10->in_room->people; local_448 != (CHAR_DATA *)0x0;
            local_448 = local_448->next_in_room) {
          if ((local_448 != local_8) && (local_448 != local_10)) {
            if (local_470 < local_10->max_hit) {
              pcVar4 = get_char_color(in_stack_fffffffffffff998,in_stack_fffffffffffff990);
              uVar10 = (undefined4)((ulong)in_stack_fffffffffffff978 >> 0x20);
              pcVar5 = END_COLOR(in_stack_fffffffffffff988);
              pcVar6 = get_descr_form(in_stack_fffffffffffff988,
                                      (CHAR_DATA *)
                                      CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980),
                                      SUB41((uint)uVar10 >> 0x18,0));
              in_stack_fffffffffffff978 = (char *)CONCAT44(uVar10,(int)local_489);
              sprintf(local_138,"$n %s%s%s %s%c",pcVar4,local_458,pcVar5,pcVar6);
              act(in_stack_fffffffffffff990,in_stack_fffffffffffff988,
                  (void *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980),
                  in_stack_fffffffffffff978,0);
            }
            else {
              pcVar4 = get_descr_form(in_stack_fffffffffffff988,
                                      (CHAR_DATA *)
                                      CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980),
                                      SUB81((ulong)in_stack_fffffffffffff978 >> 0x38,0));
              sprintf(local_138,"$n\'s assault slays %s outright!",pcVar4);
              act(in_stack_fffffffffffff990,in_stack_fffffffffffff988,
                  (void *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980),
                  in_stack_fffffffffffff978,0);
            }
          }
        }
        pcVar4 = get_char_color(in_stack_fffffffffffff998,in_stack_fffffffffffff990);
        pcVar5 = END_COLOR(in_stack_fffffffffffff988);
        sprintf(local_238,"You %s%s%s $N%c",pcVar4,local_450,pcVar5,(ulong)(uint)(int)local_489);
        pcVar4 = get_char_color(in_stack_fffffffffffff998,in_stack_fffffffffffff990);
        pcVar5 = END_COLOR(in_stack_fffffffffffff988);
        sprintf(local_338,"$n %s%s%s you%c",pcVar4,local_458,pcVar5,(ulong)(uint)(int)local_489);
      }
    }
    else {
      if (((int)local_18 < 0) || (799 < (int)local_18)) {
        if (((int)local_18 < 1000) || (0x425 < (int)local_18)) {
          local_18 = 0x3f9;
          pvVar7 = std::vector<attack_type,_std::allocator<attack_type>_>::operator[]
                             (&attack_table,0);
          local_460 = (CHAR_DATA *)pvVar7->noun;
        }
        else {
          pvVar7 = std::vector<attack_type,_std::allocator<attack_type>_>::operator[]
                             (&attack_table,(long)(int)(local_18 - 1000));
          local_460 = (CHAR_DATA *)pvVar7->noun;
        }
      }
      else {
        local_460 = (CHAR_DATA *)skill_table[(int)local_18].noun_damage;
      }
      bVar9 = local_28 != 0;
      if (bVar9) {
        local_460 = (CHAR_DATA *)palloc_string(in_stack_fffffffffffff9a8);
      }
      if ((local_460 == (CHAR_DATA *)0x0) ||
         (sVar8 = strlen((char *)local_460), *(char *)((long)local_460 + (sVar8 - 1)) != '$')) {
        if ((local_460 != (CHAR_DATA *)0x0) &&
           (sVar8 = strlen((char *)local_460), *(char *)((long)local_460 + (sVar8 - 1)) == '#')) {
          palloc_string(in_stack_fffffffffffff9a8);
          chop((char *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980));
          if (bVar9) {
            free_pstring((char *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980));
          }
          local_460 = (CHAR_DATA *)palloc_string(in_stack_fffffffffffff9a8);
          free_pstring((char *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980));
        }
      }
      else {
        local_458 = local_450;
        palloc_string(in_stack_fffffffffffff9a8);
        chop((char *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980));
        if (bVar9) {
          free_pstring((char *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980));
        }
        local_460 = (CHAR_DATA *)palloc_string(in_stack_fffffffffffff9a8);
        free_pstring((char *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980));
      }
      if ((local_19 & 1) == 0) {
        if ((local_460 == (CHAR_DATA *)0x0) ||
           (sVar8 = strlen((char *)local_460), *(char *)((long)local_460 + (sVar8 - 1)) != '*')) {
          if (local_8 == local_10) {
            for (local_448 = local_10->in_room->people; local_448 != (CHAR_DATA *)0x0;
                local_448 = local_448->next_in_room) {
              if ((local_448 != local_8) && (local_448 != local_10)) {
                if (local_470 < local_10->max_hit) {
                  pcVar4 = get_char_color(in_stack_fffffffffffff998,in_stack_fffffffffffff990);
                  uVar10 = (undefined4)((ulong)in_stack_fffffffffffff978 >> 0x20);
                  pcVar5 = END_COLOR(in_stack_fffffffffffff988);
                  in_stack_fffffffffffff978 = (char *)CONCAT44(uVar10,(int)local_489);
                  sprintf(local_138,"$n\'s %s %s%s%s $m%c",local_460,pcVar4,local_458,pcVar5);
                }
                else {
                  sprintf(local_138,"$n\'s %s slays $m outright!",local_460);
                }
                act(in_stack_fffffffffffff990,in_stack_fffffffffffff988,
                    (void *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980),
                    in_stack_fffffffffffff978,0);
              }
            }
            if (local_470 < local_10->max_hit) {
              pcVar4 = get_char_color(in_stack_fffffffffffff998,in_stack_fffffffffffff990);
              uVar10 = (undefined4)((ulong)in_stack_fffffffffffff978 >> 0x20);
              pcVar5 = END_COLOR(in_stack_fffffffffffff988);
              in_stack_fffffffffffff978 = (char *)CONCAT44(uVar10,(int)local_489);
              sprintf(local_238,"Your %s %s%s%s you%c",local_460,pcVar4,local_458,pcVar5);
            }
            else {
              sprintf(local_238,"Your %s slays you outright!",local_460);
            }
          }
          else {
            for (local_448 = local_10->in_room->people; local_448 != (CHAR_DATA *)0x0;
                local_448 = local_448->next_in_room) {
              if ((local_448 != local_8) && (local_448 != local_10)) {
                if (local_470 < local_10->max_hit) {
                  pcVar4 = get_char_color(in_stack_fffffffffffff998,in_stack_fffffffffffff990);
                  uVar11 = (undefined1)((ulong)in_stack_fffffffffffff978 >> 0x38);
                  pcVar5 = END_COLOR(in_stack_fffffffffffff988);
                  in_stack_fffffffffffff978 =
                       get_descr_form(in_stack_fffffffffffff988,
                                      (CHAR_DATA *)
                                      CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980),
                                      (bool)uVar11);
                  in_stack_fffffffffffff980 = (int)local_489;
                  sprintf(local_138,"$n\'s %s %s%s%s %s%c",local_460,pcVar4,local_458,pcVar5);
                }
                else {
                  pcVar4 = get_descr_form(in_stack_fffffffffffff988,
                                          (CHAR_DATA *)
                                          CONCAT44(in_stack_fffffffffffff984,
                                                   in_stack_fffffffffffff980),
                                          SUB81((ulong)in_stack_fffffffffffff978 >> 0x38,0));
                  sprintf(local_138,"$n\'s %s slays %s outright!",local_460,pcVar4);
                }
                act(in_stack_fffffffffffff990,in_stack_fffffffffffff988,
                    (void *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980),
                    in_stack_fffffffffffff978,0);
              }
            }
            if (local_470 < local_10->max_hit) {
              pcVar4 = get_char_color(in_stack_fffffffffffff998,in_stack_fffffffffffff990);
              uVar10 = (undefined4)((ulong)in_stack_fffffffffffff978 >> 0x20);
              pcVar5 = END_COLOR(in_stack_fffffffffffff988);
              in_stack_fffffffffffff978 = (char *)CONCAT44(uVar10,(int)local_489);
              sprintf(local_238,"Your %s %s%s%s $N%c",local_460,pcVar4,local_458,pcVar5);
            }
            else {
              sprintf(local_238,"Your %s slays $N outright!",local_460);
            }
            if (local_470 < local_10->max_hit) {
              in_stack_fffffffffffff990 = local_338;
              pCVar12 = local_460;
              pcVar4 = get_char_color(local_460,in_stack_fffffffffffff990);
              uVar10 = (undefined4)((ulong)in_stack_fffffffffffff978 >> 0x20);
              pcVar5 = END_COLOR(in_stack_fffffffffffff988);
              in_stack_fffffffffffff978 = (char *)CONCAT44(uVar10,(int)local_489);
              sprintf(in_stack_fffffffffffff990,"$n\'s %s %s%s%s you%c",pCVar12,pcVar4,local_458,
                      pcVar5);
            }
            else {
              sprintf(local_338,"$n\'s %s slays you outright!",local_460);
            }
          }
        }
        else {
          palloc_string(in_stack_fffffffffffff9a8);
          chop((char *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980));
          if (bVar9) {
            free_pstring((char *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980));
          }
          local_460 = (CHAR_DATA *)palloc_string(in_stack_fffffffffffff9a8);
          bVar9 = true;
          free_pstring((char *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980));
          bVar1 = true;
          for (local_448 = local_10->in_room->people; local_448 != (CHAR_DATA *)0x0;
              local_448 = local_448->next_in_room) {
            if ((local_448 != local_8) && (local_448 != local_10)) {
              if (local_470 < local_10->max_hit) {
                pcVar4 = get_char_color(in_stack_fffffffffffff998,in_stack_fffffffffffff990);
                uVar11 = (undefined1)((ulong)in_stack_fffffffffffff978 >> 0x38);
                pcVar5 = END_COLOR(in_stack_fffffffffffff988);
                in_stack_fffffffffffff978 =
                     get_descr_form(in_stack_fffffffffffff988,
                                    (CHAR_DATA *)
                                    CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980),
                                    (bool)uVar11);
                in_stack_fffffffffffff980 = (int)local_489;
                sprintf(local_138,"%s %s%s%s %s%c",local_460,pcVar4,local_458,pcVar5);
              }
              else {
                pcVar4 = get_descr_form(in_stack_fffffffffffff988,
                                        (CHAR_DATA *)
                                        CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980
                                                ),SUB81((ulong)in_stack_fffffffffffff978 >> 0x38,0))
                ;
                sprintf(local_138,"%s slays %s outright!",local_460,pcVar4);
              }
              act(in_stack_fffffffffffff990,in_stack_fffffffffffff988,
                  (void *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980),
                  in_stack_fffffffffffff978,0);
            }
          }
          if (local_8 == local_10) {
            if (local_470 < local_10->max_hit) {
              pcVar4 = get_char_color(in_stack_fffffffffffff998,in_stack_fffffffffffff990);
              uVar10 = (undefined4)((ulong)in_stack_fffffffffffff978 >> 0x20);
              pcVar5 = END_COLOR(in_stack_fffffffffffff988);
              in_stack_fffffffffffff978 = (char *)CONCAT44(uVar10,(int)local_489);
              sprintf(local_238,"%s %s%s%s you%c",local_460,pcVar4,local_458,pcVar5);
            }
            else {
              sprintf(local_238,"%s slays you outright!",local_460);
            }
          }
          else if (local_470 < local_10->max_hit) {
            pcVar4 = get_char_color(in_stack_fffffffffffff998,in_stack_fffffffffffff990);
            uVar10 = (undefined4)((ulong)in_stack_fffffffffffff978 >> 0x20);
            pcVar5 = END_COLOR(in_stack_fffffffffffff988);
            in_stack_fffffffffffff978 = (char *)CONCAT44(uVar10,(int)local_489);
            sprintf(local_238,"%s %s%s%s $N%c",local_460,pcVar4,local_458,pcVar5);
          }
          else {
            sprintf(local_238,"%s slays $N outright!",local_460);
          }
          if (local_470 < local_10->max_hit) {
            pcVar4 = get_char_color(in_stack_fffffffffffff998,in_stack_fffffffffffff990);
            uVar10 = (undefined4)((ulong)in_stack_fffffffffffff978 >> 0x20);
            pcVar5 = END_COLOR(in_stack_fffffffffffff988);
            in_stack_fffffffffffff978 = (char *)CONCAT44(uVar10,(int)local_489);
            sprintf(local_338,"%s %s%s%s you%c",local_460,pcVar4,local_458,pcVar5);
          }
          else {
            sprintf(local_338,"%s slays you outright!",local_460);
          }
        }
      }
      else if ((local_460 == (CHAR_DATA *)0x0) ||
              (sVar8 = strlen((char *)local_460), *(char *)((long)local_460 + (sVar8 - 1)) != '*'))
      {
        if (local_8 == local_10) {
          sprintf(local_138,"$n is unaffected by $s %s.",local_460);
          sprintf(local_238,"You are unaffected by your %s.",local_460);
        }
        else {
          sprintf(local_138,"$N is unaffected by $n\'s %s!",local_460);
          sprintf(local_238,"$N is unaffected by your %s!",local_460);
          sprintf(local_338,"You are unaffected by $n\'s %s!",local_460);
        }
      }
      else {
        palloc_string(in_stack_fffffffffffff9a8);
        chop((char *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980));
        if (bVar9) {
          free_pstring((char *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980));
        }
        local_460 = (CHAR_DATA *)palloc_string(in_stack_fffffffffffff9a8);
        bVar9 = true;
        free_pstring((char *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980));
        bVar1 = true;
        sprintf(local_138,"$N is unaffected by %s!",local_460);
        if (local_8 == local_10) {
          sprintf(local_238,"You are unaffected by %s!",local_460);
        }
        else {
          sprintf(local_238,"$N is unaffected by %s!",local_460);
        }
        sprintf(local_338,"You are unaffected by %s!",local_460);
      }
    }
    bVar2 = str_cmp((char *)local_460,"");
    if (!bVar2) {
      sprintf(local_438,"Log: Damage without noun. Char: %s, Victim: %s, DT: %d",local_8->true_name,
              local_10->true_name,(ulong)local_18);
      wiznet(in_stack_00000bf0,in_stack_00000be8,in_stack_00000be0,in_stack_00000bd8,
             in_stack_00000bd0,in_stack_00000bcc);
    }
    if (local_8 == local_10) {
      act_new(in_stack_00001ed0,in_stack_00001ec8,in_stack_00001ec0,in_stack_00001eb8,
              in_stack_00001eb4,in_stack_00001eb0);
    }
    else {
      if ((!bVar1) || (local_8->in_room == local_10->in_room)) {
        act(in_stack_fffffffffffff990,in_stack_fffffffffffff988,
            (void *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980),
            in_stack_fffffffffffff978,0);
      }
      act(in_stack_fffffffffffff990,in_stack_fffffffffffff988,
          (void *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980),
          in_stack_fffffffffffff978,0);
    }
    if (bVar9) {
      free_pstring((char *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980));
    }
  }
  return;
}

Assistant:

void dam_message(CHAR_DATA *ch, CHAR_DATA *victim, int dam, int dt, bool immune, char *dnoun, bool reduced)
{
	char buf1[256], buf2[256], buf3[256], buf97[256];
	OBJ_DATA *wield;
	CHAR_DATA *gch;
	const char *vs;
	const char *vp;
	char *attack = nullptr, *attack2;
	char punct;
	int prop;
	bool asterisk = false, duped = false;

	if (dam < 0)
		prop = 0;
	else
		prop = dam;

	if (ch == nullptr || victim == nullptr || !victim->in_room || !ch->in_room)
		return;

	if (reduced)
	{
		vs = "\x01B[0mfail to harm";
		vp = "\x01B[0mfails to harm";
	}
	else if (prop == 0)
	{
		vs = "miss";
		vp = "misses";
	}
	else if (prop <= 2)
	{
		vs = "scratch";
		vp = "scratches";
	}
	else if (prop <= 4)
	{
		vs = "graze";
		vp = "grazes";
	}
	else if (prop <= 7)
	{
		vs = "hit";
		vp = "hits";
	}
	else if (prop <= 11)
	{
		vs = "injure";
		vp = "injures";
	}
	else if (prop <= 15)
	{
		vs = "wound";
		vp = "wounds";
	}
	else if (prop <= 20)
	{
		vs = "maul";
		vp = "mauls";
	}
	else if (prop <= 25)
	{
		vs = "decimate";
		vp = "decimates";
	}
	else if (prop <= 30)
	{
		vs = "devastate";
		vp = "devastates";
	}
	else if (prop <= 37)
	{
		vs = "maim";
		vp = "maims";
	}
	else if (prop <= 45)
	{
		vs = "MUTILATE";
		vp = "MUTILATES";
	}
	else if (prop <= 55)
	{
		vs = "EVISCERATE";
		vp = "EVISCERATES";
	}
	else if (prop <= 65)
	{
		vs = "DISMEMBER";
		vp = "DISMEMBERS";
	}
	else if (prop <= 85)
	{
		vs = "MASSACRE";
		vp = "MASSACRES";
	}
	else if (prop <= 100)
	{
		vs = "MANGLE";
		vp = "MANGLES";
	}
	else if (prop <= 135)
	{
		vs = "*** DEMOLISH ***";
		vp = "*** DEMOLISHES ***";
	}
	else if (prop <= 160)
	{
		vs = "*** DEVASTATE ***";
		vp = "*** DEVASTATES ***";
	}
	else if (prop <= 250)
	{
		vs = "=== OBLITERATE ===";
		vp = "=== OBLITERATES ===";
	}
	else if (prop <= 330)
	{
		vs = ">>> ANNIHILATE <<<";
		vp = ">>> ANNIHILATES <<<";
	}
	else if (prop <= 380)
	{
		vs = "<<< ERADICATE >>>";
		vp = "<<< ERADICATES >>>";
	}
	else
	{
		vs = "do UNSPEAKABLE things to";
		vp = "does UNSPEAKABLE things to";
	}

	punct = (prop <= 33) ? '.' : '!';

	/* Now quickly set dual wield weapon dt to real weapon dt - this allows
	dual wielded weapons to be kept track of until this point, now we no
	longer need to know if the weapon doing the dam is the dual one, just what
	it's actual dt is
	-Ceran
	*/
	if (dt == gsn_dual_wield)
	{
		if (dt == gsn_dual_wield)
			wield = get_eq_char(ch, WEAR_DUAL_WIELD);

		dt = TYPE_HIT;

		if (wield != nullptr)
			dt += wield->value[3];
		else
			dt += ch->dam_type;
	}

	if (dt == TYPE_HIT)
	{
		if (ch == victim)
		{
			if (prop < victim->max_hit)
			{
				sprintf(buf1, "$n %s $mself%c", vp, punct);
				sprintf(buf2, "You %s%s%s yourself%c", get_char_color(ch, "damage"), vs, END_COLOR(ch), punct);
			}
			else
			{
				sprintf(buf1, "$n's assault slays $mself outright!");
				sprintf(buf2, "Your assault slays you outright!");
			}
		}
		else
		{
			for (gch = victim->in_room->people; gch != nullptr; gch = gch->next_in_room)
			{
				if (gch != ch && gch != victim)
				{
					if (prop < victim->max_hit)
					{
						sprintf(buf1, "$n %s%s%s %s%c", get_char_color(gch, "damage"), vp, END_COLOR(gch), get_descr_form(victim, gch, false), punct);
						act(buf1, ch, nullptr, gch, TO_VICT);
					}
					else
					{
						sprintf(buf1, "$n's assault slays %s outright!", get_descr_form(victim, gch, false));
						act(buf1, ch, nullptr, gch, TO_VICT);
					}
				}
			}

			sprintf(buf2, "You %s%s%s $N%c", get_char_color(ch, "damage"), vs, END_COLOR(ch), punct);
			sprintf(buf3, "$n %s%s%s you%c", get_char_color(victim, "damage"), vp, END_COLOR(victim), punct);
		}
	}
	else
	{
		if (dt >= 0 && dt < MAX_SKILL)
		{
			attack = skill_table[dt].noun_damage;
		}
		else if (dt >= TYPE_HIT && dt < TYPE_HIT + MAX_DAMAGE_MESSAGE)
		{
			attack = attack_table[dt - TYPE_HIT].noun;
		}
		else
		{
			dt = TYPE_HIT + 17;
			attack = attack_table[0].noun;
		}

		if (dnoun)
		{
			duped = true;
			attack = palloc_string(dnoun);
		}

		if (attack && attack[strlen(attack) - 1] == '$')
		{
			vp = vs;
			attack2 = palloc_string(attack);

			chop(attack2);

			if (duped)
				free_pstring(attack);

			attack = palloc_string(attack2);
			free_pstring(attack2);
		}
		else if (attack && attack[strlen(attack) - 1] == '#')
		{
			vs = vp;
			attack2 = palloc_string(attack);
			chop(attack2);

			if (duped)
				free_pstring(attack);

			attack = palloc_string(attack2);
			free_pstring(attack2);
		}

		if (immune)
		{
			if (attack && attack[strlen(attack) - 1] == '*')
			{
				attack2 = palloc_string(attack);
				chop(attack2);

				if (duped)
					free_pstring(attack);

				attack = palloc_string(attack2);
				duped = true;

				free_pstring(attack2);

				asterisk = true;

				sprintf(buf1, "$N is unaffected by %s!", attack);
				if (ch == victim)
					sprintf(buf2, "You are unaffected by %s!", attack);
				else
					sprintf(buf2, "$N is unaffected by %s!", attack);

				sprintf(buf3, "You are unaffected by %s!", attack);
			}
			else
			{
				if (ch == victim)
				{
					sprintf(buf1, "$n is unaffected by $s %s.", attack);
					sprintf(buf2, "You are unaffected by your %s.", attack);
				}
				else
				{
					sprintf(buf1, "$N is unaffected by $n's %s!", attack);
					sprintf(buf2, "$N is unaffected by your %s!", attack);
					sprintf(buf3, "You are unaffected by $n's %s!", attack);
				}
			}
		}
		else
		{
			if (attack && attack[strlen(attack) - 1] == '*')
			{
				attack2 = palloc_string(attack);
				chop(attack2);

				if (duped)
					free_pstring(attack);

				attack = palloc_string(attack2);
				duped = true;

				free_pstring(attack2);
				asterisk = true;

				for (gch = victim->in_room->people; gch != nullptr; gch = gch->next_in_room)
				{
					if (gch != ch && gch != victim)
					{
						if (prop < victim->max_hit)
						{
							sprintf(buf1, "%s %s%s%s %s%c",
								attack,
								get_char_color(gch, "damage"),
								vp,
								END_COLOR(gch),
								get_descr_form(victim, gch, false),
								punct);
						}
						else
						{
							sprintf(buf1, "%s slays %s outright!", attack, get_descr_form(victim, gch, false));
						}

						act(buf1, ch, nullptr, gch, TO_VICT);
					}
				}

				if (ch == victim)
				{
					if (prop < victim->max_hit)
					{
						sprintf(buf2, "%s %s%s%s you%c",
							attack,
							get_char_color(ch, "damage"),
							vp,
							END_COLOR(ch),
							punct);
					}
					else
					{
						sprintf(buf2, "%s slays you outright!", attack);
					}
				}
				else
				{
					if (prop < victim->max_hit)
					{
						sprintf(buf2, "%s %s%s%s $N%c",
							attack,
							get_char_color(ch, "damage"),
							vp,
							END_COLOR(ch),
							punct);
					}
					else
					{
						sprintf(buf2, "%s slays $N outright!", attack);
					}
				}

				if (prop < victim->max_hit)
				{
					sprintf(buf3, "%s %s%s%s you%c",
						attack,
						get_char_color(victim, "damage"),
						vp,
						END_COLOR(victim),
						punct);
				}
				else
				{
					sprintf(buf3, "%s slays you outright!", attack);
				}
			}
			else if (ch == victim)
			{
				for (gch = victim->in_room->people; gch != nullptr; gch = gch->next_in_room)
				{
					if (gch != ch && gch != victim)
					{
						if (prop < victim->max_hit)
						{
							sprintf(buf1, "$n's %s %s%s%s $m%c",
								attack,
								get_char_color(gch, "damage"),
								vp,
								END_COLOR(gch),
								punct);
						}
						else
						{
							sprintf(buf1, "$n's %s slays $m outright!", attack);
						}

						act(buf1, ch, nullptr, gch, TO_VICT);
					}
				}

				if (prop < victim->max_hit)
				{
					sprintf(buf2, "Your %s %s%s%s you%c",
						attack,
						get_char_color(ch, "damage"),
						vp,
						END_COLOR(ch),
						punct);
				}
				else
				{
					sprintf(buf2, "Your %s slays you outright!", attack);
				}
			}
			else
			{
				for (gch = victim->in_room->people; gch != nullptr; gch = gch->next_in_room)
				{
					if (gch != ch && gch != victim)
					{
						if (prop < victim->max_hit)
						{
							sprintf(buf1, "$n's %s %s%s%s %s%c",
								attack,
								get_char_color(gch, "damage"),
								vp,
								END_COLOR(gch),
								get_descr_form(victim, gch, false),
								punct);
						}
						else
						{
							sprintf(buf1, "$n's %s slays %s outright!", attack, get_descr_form(victim, gch, false));
						}

						act(buf1, ch, nullptr, gch, TO_VICT);
					}
				}

				if (prop < victim->max_hit)
				{
					sprintf(buf2, "Your %s %s%s%s $N%c",
						attack,
						get_char_color(ch, "damage"),
						vp,
						END_COLOR(ch),
						punct);
				}
				else
				{
					sprintf(buf2, "Your %s slays $N outright!", attack);
				}

				if (prop < victim->max_hit)
				{
					sprintf(buf3, "$n's %s \%s%s%s you%c",
						attack,
						get_char_color(victim, "damage"),
						vp,
						END_COLOR(victim),
						punct);
				}
				else
				{
					sprintf(buf3, "$n's %s slays you outright!", attack);
				}
			}
		}
	}

	if (!str_cmp(attack, ""))
	{
		sprintf(buf97, "Log: Damage without noun. Char: %s, Victim: %s, DT: %d", ch->true_name, victim->true_name, dt);
		wiznet(buf97, nullptr, nullptr, WIZ_LOG, 0, 0);
	}

	if (ch == victim)
	{
		act_new(buf2, ch, nullptr, nullptr, TO_CHAR, POS_INCAP);
	}
	else
	{
		if (!(asterisk && ch->in_room != victim->in_room))
			act(buf2, ch, nullptr, victim, TO_CHAR);

		act(buf3, ch, nullptr, victim, TO_VICT);
	}

	if (duped)
		free_pstring(attack);
}